

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

void __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::run(reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
      *this,string *host,string *port_str)

{
  element_type *peVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_e0;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  string *port_str_local;
  string *host_local;
  reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *this_local;
  
  local_20 = port_str;
  port_str_local = host;
  host_local = (string *)this;
  select(this,(int)host,(fd_set *)port_str,in_RCX,in_R8,in_R9);
  peVar1 = std::
           __shared_ptr_access<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->logic);
  std::__cxx11::string::string(local_40,(string *)host);
  std::__cxx11::string::string(local_60,(string *)port_str);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(&local_e0,&this->request_);
  (*peVar1->_vptr_interface[9])(peVar1,local_40,local_60,&local_e0);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&local_e0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void run(std::string host, std::string port_str)
		{
			select();
			logic->run(std::move(host), std::move(port_str), request_);
		}